

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeBlocks.cpp
# Opt level: O2

Block * __thiscall
wasm::MergeBlocks::optimize
          (MergeBlocks *this,Expression *curr,Expression **child,Block *outer,
          Expression **dependency1,Expression **dependency2)

{
  ExpressionList *this_00;
  ExpressionList *this_01;
  Block *this_02;
  uintptr_t uVar1;
  bool bVar2;
  uint uVar3;
  Expression **ppEVar4;
  optional<wasm::Type> type_;
  undefined1 local_2f8 [8];
  EffectAnalyzer childEffects;
  
  if (*child != (Expression *)0x0) {
    if (((dependency1 != (Expression **)0x0) && (*dependency1 != (Expression *)0x0)) ||
       ((dependency2 != (Expression **)0x0 && (*dependency2 != (Expression *)0x0)))) {
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)local_2f8,
                 &((this->
                   super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                   ).super_Pass.runner)->options,
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                 ).
                 super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                 .
                 super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                 .currModule,*child);
      if ((dependency1 != (Expression **)0x0) && (*dependency1 != (Expression *)0x0)) {
        EffectAnalyzer::EffectAnalyzer
                  ((EffectAnalyzer *)
                   &childEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   &((this->
                     super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                     ).super_Pass.runner)->options,
                   (this->
                   super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                   ).
                   super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                   .
                   super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                   .currModule,*dependency1);
        bVar2 = EffectAnalyzer::invalidates
                          ((EffectAnalyzer *)
                           &childEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,(EffectAnalyzer *)local_2f8);
        EffectAnalyzer::~EffectAnalyzer
                  ((EffectAnalyzer *)
                   &childEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
        if (bVar2) {
          EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_2f8);
          return outer;
        }
      }
      if ((dependency2 == (Expression **)0x0) || (*dependency2 == (Expression *)0x0)) {
        EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_2f8);
      }
      else {
        EffectAnalyzer::EffectAnalyzer
                  ((EffectAnalyzer *)
                   &childEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   &((this->
                     super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                     ).super_Pass.runner)->options,
                   (this->
                   super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                   ).
                   super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                   .
                   super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                   .currModule,*dependency2);
        bVar2 = EffectAnalyzer::invalidates
                          ((EffectAnalyzer *)
                           &childEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,(EffectAnalyzer *)local_2f8);
        EffectAnalyzer::~EffectAnalyzer
                  ((EffectAnalyzer *)
                   &childEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
        EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_2f8);
        if (bVar2) {
          return outer;
        }
      }
    }
    this_02 = (Block *)*child;
    if ((((this_02->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id ==
          BlockId) && ((this_02->name).super_IString.str._M_str == (char *)0x0)) &&
       (1 < (this_02->list).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements)
       ) {
      this_00 = &this_02->list;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                          (&this_00->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
      uVar1 = ((*ppEVar4)->type).id;
      if ((uVar1 != 1) &&
         ((this_02->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id ==
          uVar1)) {
        *child = *ppEVar4;
        this->refinalize = true;
        if (outer == (Block *)0x0) {
          ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                              (&this_00->
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              );
          *ppEVar4 = curr;
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 1;
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               (_Storage<wasm::Type,_true>)(curr->type).id;
          Block::finalize(this_02,type_,Unknown);
          Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>::
          replaceCurrent(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                          ).
                          super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                          .
                          super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                         ,(Expression *)this_02);
          outer = this_02;
        }
        else {
          this_01 = &outer->list;
          ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                              (&this_01->
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              );
          if (*ppEVar4 != curr) {
            __assert_fail("outer->list.back() == curr",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MergeBlocks.cpp"
                          ,0x22a,
                          "Block *wasm::MergeBlocks::optimize(Expression *, Expression *&, Block *, Expression **, Expression **)"
                         );
          }
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::pop_back
                    (&this_01->
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
          for (uVar3 = 0;
              (ulong)uVar3 <
              (this_02->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements - 1; uVar3 = uVar3 + 1) {
            ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                      operator[](&this_00->
                                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                 ,(ulong)uVar3);
            ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                      (&this_01->
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                       *ppEVar4);
          }
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&this_01->
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     curr);
        }
      }
    }
  }
  return outer;
}

Assistant:

Block* optimize(Expression* curr,
                  Expression*& child,
                  Block* outer = nullptr,
                  Expression** dependency1 = nullptr,
                  Expression** dependency2 = nullptr) {
    if (!child) {
      return outer;
    }
    if ((dependency1 && *dependency1) || (dependency2 && *dependency2)) {
      // there are dependencies, things we must be reordered through. make sure
      // no problems there
      EffectAnalyzer childEffects(getPassOptions(), *getModule(), child);
      if (dependency1 && *dependency1 &&
          EffectAnalyzer(getPassOptions(), *getModule(), *dependency1)
            .invalidates(childEffects)) {
        return outer;
      }
      if (dependency2 && *dependency2 &&
          EffectAnalyzer(getPassOptions(), *getModule(), *dependency2)
            .invalidates(childEffects)) {
        return outer;
      }
    }
    if (auto* block = child->dynCast<Block>()) {
      if (!block->name.is() && block->list.size() >= 2) {
        auto* back = block->list.back();
        if (back->type == Type::unreachable) {
          // curr is not reachable, dce could remove it; don't try anything
          // fancy here
          return outer;
        }
        // We are going to replace the block with the final element, so they
        // should be identically typed. Note that we could check for subtyping
        // here, but it would not help in the general case: we know that this
        // block has no breaks (as confirmed above), and so the local-subtyping
        // pass will turn its type into that of its final element, if the final
        // element has a more specialized type. (If we did want to handle that,
        // we'd need to then run a ReFinalize after everything, which would add
        // more complexity here.)
        if (block->type != back->type) {
          return outer;
        }
        child = back;
        refinalize = true;
        if (outer == nullptr) {
          // reuse the block, move it out
          block->list.back() = curr;
          // we want the block outside to have the same type as curr had
          block->finalize(curr->type);
          replaceCurrent(block);
          return block;
        } else {
          // append to an existing outer block
          assert(outer->list.back() == curr);
          outer->list.pop_back();
          for (Index i = 0; i < block->list.size() - 1; i++) {
            outer->list.push_back(block->list[i]);
          }
          outer->list.push_back(curr);
        }
      }
    }
    return outer;
  }